

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdecode.c
# Opt level: O3

ptrdiff_t rcnb_decode_block(wchar_t *code_in,size_t length_in,char *plaintext_out,
                           rcnb_decodestate *state_in)

{
  long lVar1;
  _Bool _Var2;
  long lVar3;
  ulong uVar4;
  ptrdiff_t pVar5;
  long lVar6;
  ulong uVar7;
  wchar_t *value_in;
  bool bVar8;
  char *plaintext_char;
  char *local_48;
  rcnb_decodestate *local_40;
  char *local_38;
  
  uVar7 = state_in->i;
  if (length_in != 0 && uVar7 < 4) {
    lVar3 = 0;
    lVar6 = 0;
    do {
      state_in->trailing_code[uVar7 + lVar6] = code_in[lVar6];
      lVar1 = lVar6 + 1;
      lVar3 = lVar3 + -4;
      if (2 < uVar7 + lVar6) break;
      bVar8 = length_in - 1 != lVar6;
      lVar6 = lVar1;
    } while (bVar8);
    state_in->i = uVar7 + lVar1;
    code_in = (wchar_t *)((long)code_in - lVar3);
    length_in = length_in - lVar1;
  }
  if (length_in == 0) {
    pVar5 = 0;
  }
  else {
    local_48 = plaintext_out;
    _Var2 = rcnb_decode_short(state_in->trailing_code,&local_48);
    pVar5 = -1;
    if (_Var2) {
      state_in->i = 0;
      local_40 = state_in;
      local_38 = plaintext_out;
      if (3 < length_in) {
        uVar7 = length_in >> 2;
        value_in = code_in;
        do {
          _Var2 = rcnb_decode_short(value_in,&local_48);
          if (!_Var2) {
            return -1;
          }
          value_in = value_in + 4;
          uVar7 = uVar7 - 1;
        } while (uVar7 != 0);
      }
      uVar7 = length_in & 3;
      local_40->i = uVar7;
      if (uVar7 != 0) {
        uVar4 = 0;
        do {
          state_in->trailing_code[uVar4] = code_in[(length_in & 0xfffffffffffffffc) + uVar4];
          uVar4 = uVar4 + 1;
        } while (uVar7 != uVar4);
      }
      *local_48 = '\0';
      pVar5 = (long)local_48 - (long)local_38;
    }
  }
  return pVar5;
}

Assistant:

ptrdiff_t rcnb_decode_block(const wchar_t* code_in, size_t length_in,
        char* const plaintext_out, rcnb_decodestate* state_in)
{
    char* plaintext_char = plaintext_out;
    bool res;
    while (state_in->i < 4 && length_in > 0) {
        state_in->trailing_code[state_in->i++] = code_in[0];
        length_in--;
        code_in++;
    }
    if (length_in == 0)
        return 0;
    res = rcnb_decode_short(state_in->trailing_code, &plaintext_char);
    if (!res)
        return -1;
    state_in->i = 0;
#if defined(ENABLE_AVX2) || defined(ENABLE_SSSE3) || defined(ENABLE_NEON)
    size_t batch = length_in >> 6;
    if (batch > 0) {
        res = rcnb_decode_32n_asm((const char *)code_in, plaintext_char, batch);
        if (!res)
            return -1;
    }
    plaintext_char += 32 * batch;
    code_in += 64 * batch;
    length_in = length_in & 63;
#endif
    for (int i = 0; i < (length_in >> 2); ++i) {
        res = rcnb_decode_short(code_in + i * 4, &plaintext_char);
        if (!res)
            return -1;
    }
    state_in->i = length_in % 4;
    for (size_t j = 0; j < state_in->i; ++j) {
        state_in->trailing_code[j] = code_in[length_in - state_in->i + j];
    }
    *plaintext_char = 0;
    return plaintext_char - plaintext_out;
}